

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_container_shrink_to_fit(run_container_t *src)

{
  int iVar1;
  rle16_t *prVar2;
  int iVar3;
  rle16_t *prVar4;
  int iVar5;
  
  iVar1 = src->n_runs;
  iVar5 = src->capacity - iVar1;
  iVar3 = 0;
  if (iVar5 != 0) {
    src->capacity = iVar1;
    prVar2 = src->runs;
    prVar4 = (rle16_t *)(*global_memory_hook.realloc)(prVar2,(long)iVar1 << 2);
    src->runs = prVar4;
    iVar3 = iVar5;
    if (prVar4 == (rle16_t *)0x0) {
      (*global_memory_hook.free)(prVar2);
    }
  }
  return iVar3;
}

Assistant:

int run_container_shrink_to_fit(run_container_t *src) {
    if (src->n_runs == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->n_runs;
    src->capacity = src->n_runs;
    rle16_t *oldruns = src->runs;
    src->runs =
        (rle16_t *)roaring_realloc(oldruns, src->capacity * sizeof(rle16_t));
    if (src->runs == NULL) roaring_free(oldruns);  // should never happen?
    return savings;
}